

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

lu_mem singlestep(lua_State *L)

{
  global_State *g;
  GCObject *pGVar1;
  global_State *g_00;
  GCObject *pGVar2;
  lua_State *plVar3;
  UpVal *pUVar4;
  lu_mem lVar5;
  lu_mem lVar6;
  long lVar7;
  int iVar8;
  lu_mem lVar9;
  GCObject **nextlist;
  GCObject *f;
  GCObject *f_00;
  l_mem lVar10;
  anon_union_16_2_5131162a_for_u *paVar11;
  lua_State **pplVar12;
  int iStack_40;
  
  g = L->l_G;
  switch(g->gcstate) {
  case '\0':
    g->GCmemtrav = 0;
    propagatemark(g);
    if (g->gray == (GCObject *)0x0) {
      g->gcstate = '\x01';
    }
    goto LAB_00112be8;
  case '\x01':
    propagateall(g);
    g_00 = L->l_G;
    pGVar1 = g_00->grayagain;
    g_00->gcstate = '\b';
    g_00->GCmemtrav = 0;
    if ((L->marked & 3) != 0) {
      reallymarkobject(g_00,(GCObject *)L);
    }
    if ((((g_00->l_registry).tt_ & 0x40) != 0) &&
       (pGVar2 = (g_00->l_registry).value_.gc, (pGVar2->marked & 3) != 0)) {
      reallymarkobject(g_00,pGVar2);
    }
    markmt(g_00);
    pplVar12 = &g_00->twups;
    while (plVar3 = *pplVar12, plVar3 != (lua_State *)0x0) {
      if (((plVar3->marked & 7) == 0) && (plVar3->openupval != (UpVal *)0x0)) {
        pplVar12 = &plVar3->twups;
      }
      else {
        *pplVar12 = plVar3->twups;
        plVar3->twups = plVar3;
        paVar11 = (anon_union_16_2_5131162a_for_u *)&plVar3->openupval;
        while (pUVar4 = (paVar11->open).next, pUVar4 != (UpVal *)0x0) {
          paVar11 = &pUVar4->u;
          if ((pUVar4->u).open.touched != 0) {
            if (((pUVar4->v->tt_ & 0x40) != 0) &&
               (pGVar2 = (pUVar4->v->value_).gc, (pGVar2->marked & 3) != 0)) {
              reallymarkobject(g_00,pGVar2);
            }
            (pUVar4->u).open.touched = 0;
          }
        }
      }
    }
    propagateall(g_00);
    lVar9 = g_00->GCmemtrav;
    g_00->gray = pGVar1;
    propagateall(g_00);
    g_00->GCmemtrav = 0;
    convergeephemerons(g_00);
    clearvalues(g_00,g_00->weak,(GCObject *)0x0);
    clearvalues(g_00,g_00->allweak,(GCObject *)0x0);
    pGVar1 = g_00->weak;
    pGVar2 = g_00->allweak;
    lVar5 = g_00->GCmemtrav;
    separatetobefnz(g_00,0);
    g_00->gcfinnum = 1;
    markbeingfnz(g_00);
    propagateall(g_00);
    g_00->GCmemtrav = 0;
    convergeephemerons(g_00);
    clearkeys(g_00,g_00->ephemeron,f);
    clearkeys(g_00,g_00->allweak,f_00);
    clearvalues(g_00,g_00->weak,pGVar1);
    clearvalues(g_00,g_00->allweak,pGVar2);
    luaS_clearcache(g_00);
    g_00->currentwhite = g_00->currentwhite ^ 3;
    lVar6 = g_00->GCmemtrav;
    entersweep(L);
    g->GCestimate = g->GCdebt + g->totalbytes;
    return lVar9 + lVar5 + lVar6;
  case '\x02':
    nextlist = &g->finobj;
    iStack_40 = 3;
    break;
  case '\x03':
    nextlist = &g->tobefnz;
    iStack_40 = 4;
    break;
  case '\x04':
    iStack_40 = 5;
    nextlist = (GCObject **)0x0;
    break;
  case '\x05':
    g->mainthread->marked = g->currentwhite & 3 | g->mainthread->marked & 0xf8;
    if (g->gckind != '\x01') {
      lVar7 = g->GCdebt;
      iVar8 = (g->strt).size;
      lVar10 = lVar7;
      if ((g->strt).nuse < iVar8 / 4) {
        luaS_resize(L,iVar8 / 2);
        lVar10 = g->GCdebt;
      }
      g->GCestimate = g->GCestimate + (lVar10 - lVar7);
    }
    g->gcstate = '\x06';
    return 0;
  case '\x06':
    if ((g->tobefnz != (GCObject *)0x0) && (g->gckind != '\x01')) {
      iVar8 = runafewfinalizers(L);
      return (long)iVar8 * 7;
    }
    g->gcstate = '\a';
    return 0;
  case '\a':
    g->GCmemtrav = (long)(g->strt).size << 3;
    g->gray = (GCObject *)0x0;
    g->grayagain = (GCObject *)0x0;
    g->allweak = (GCObject *)0x0;
    g->weak = (GCObject *)0x0;
    g->ephemeron = (GCObject *)0x0;
    if ((g->mainthread->marked & 3) != 0) {
      reallymarkobject(g,(GCObject *)g->mainthread);
    }
    if ((((g->l_registry).tt_ & 0x40) != 0) &&
       (pGVar1 = (g->l_registry).value_.gc, (pGVar1->marked & 3) != 0)) {
      reallymarkobject(g,pGVar1);
    }
    markmt(g);
    markbeingfnz(g);
    g->gcstate = '\0';
LAB_00112be8:
    return g->GCmemtrav;
  default:
    return 0;
  }
  lVar9 = sweepstep(L,g,iStack_40,nextlist);
  return lVar9;
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  switch (g->gcstate) {
    case GCSpause: {
      g->GCmemtrav = g->strt.size * sizeof(GCObject*);
      restartcollection(g);
      g->gcstate = GCSpropagate;
      return g->GCmemtrav;
    }
    case GCSpropagate: {
      g->GCmemtrav = 0;
      lua_assert(g->gray);
      propagatemark(g);
       if (g->gray == NULL)  /* no more gray objects? */
        g->gcstate = GCSatomic;  /* finish propagate phase */
      return g->GCmemtrav;  /* memory traversed in this step */
    }
    case GCSatomic: {
      lu_mem work;
      propagateall(g);  /* make sure gray list is empty */
      work = atomic(L);  /* work is what was traversed by 'atomic' */
      entersweep(L);
      g->GCestimate = gettotalbytes(g);  /* first estimate */;
      return work;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      return sweepstep(L, g, GCSswpfinobj, &g->finobj);
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      return sweepstep(L, g, GCSswptobefnz, &g->tobefnz);
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      return sweepstep(L, g, GCSswpend, NULL);
    }
    case GCSswpend: {  /* finish sweeps */
      makewhite(g, g->mainthread);  /* sweep main thread */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      return 0;
    }
    case GCScallfin: {  /* call remaining finalizers */
      if (g->tobefnz && g->gckind != KGC_EMERGENCY) {
        int n = runafewfinalizers(L);
        return (n * GCFINALIZECOST);
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        return 0;
      }
    }
    default: lua_assert(0); return 0;
  }
}